

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O0

void __thiscall
vector_block<unsigned_char_*,_1024U>::push_back
          (vector_block<unsigned_char_*,_1024U> *this,uchar **t)

{
  uchar *puVar1;
  bool bVar2;
  uchar **ppuVar3;
  uchar **t_local;
  vector_block<unsigned_char_*,_1024U> *this_local;
  
  bVar2 = is_full(this);
  if (bVar2) {
    ppuVar3 = (uchar **)malloc(0x2000);
    this->_insertpos = ppuVar3;
    std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
              (&this->_index_block,&this->_insertpos);
    this->_left_in_block = 0x400;
  }
  puVar1 = *t;
  ppuVar3 = this->_insertpos;
  this->_insertpos = ppuVar3 + 1;
  *ppuVar3 = puVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(is_full(), false)) {
			_insertpos = static_cast<T*>(malloc(B*sizeof(T)));
			_index_block.push_back(_insertpos);
			_left_in_block = B;
		}
		*_insertpos++ = t;
		--_left_in_block;
	}